

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O2

void out_int_formatted(int i)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) | 0x200;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i);
  poVar2 = std::operator<<(poVar2,"\t(decimal)\n");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
  poVar2 = std::operator<<(poVar2,"\t(octal)\n");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
  std::operator<<(poVar2,"\t(hexadecimal)\n");
  return;
}

Assistant:

void out_int_formatted(int i)
{
	std::cout << std::showbase;
	std::cout << std::dec << i << "\t(decimal)\n"
		<< std::oct << i << "\t(octal)\n"
		<< std::hex << i << "\t(hexadecimal)\n";
}